

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleRoot.cpp
# Opt level: O0

PropertyQueryFlags __thiscall
Js::ModuleRoot::GetPropertyReferenceQuery
          (ModuleRoot *this,Var originalInstance,PropertyId propertyId,Var *value,
          PropertyValueInfo *info,ScriptContext *requestContext)

{
  PropertyAttributes attributes;
  PropertyIndex propertyIndex;
  int iVar1;
  BOOL BVar2;
  Var pvVar3;
  HostObjectBase **ppHVar4;
  JavascriptLibrary *this_00;
  GlobalObject *this_01;
  GlobalObject *globalObj;
  PropertyIndex index;
  ScriptContext *requestContext_local;
  PropertyValueInfo *info_local;
  Var *value_local;
  PropertyId propertyId_local;
  Var originalInstance_local;
  ModuleRoot *this_local;
  
  propertyIndex = DynamicObject::GetPropertyIndex((DynamicObject *)this,propertyId);
  if (propertyIndex == 0xffff) {
    ppHVar4 = Memory::WriteBarrierPtr::operator_cast_to_HostObjectBase__
                        ((WriteBarrierPtr *)&(this->super_RootObjectBase).hostObject);
    if (*ppHVar4 != (HostObjectBase *)0x0) {
      ppHVar4 = Memory::WriteBarrierPtr::operator_cast_to_HostObjectBase__
                          ((WriteBarrierPtr *)&(this->super_RootObjectBase).hostObject);
      BVar2 = Js::JavascriptOperators::GetPropertyReference
                        ((RecyclableObject *)*ppHVar4,propertyId,value,requestContext,
                         (PropertyValueInfo *)0x0);
      if (BVar2 != 0) {
        return Property_NotFound;
      }
    }
    this_00 = RecyclableObject::GetLibrary((RecyclableObject *)this);
    this_01 = JavascriptLibrary::GetGlobalObject(this_00);
    this_local._4_4_ =
         GlobalObject::GetPropertyReferenceQuery
                   (this_01,originalInstance,propertyId,value,(PropertyValueInfo *)0x0,
                    requestContext);
  }
  else {
    pvVar3 = DynamicObject::GetSlot((DynamicObject *)this,(uint)propertyIndex);
    *value = pvVar3;
    if (info != (PropertyValueInfo *)0x0) {
      iVar1 = (*(this->super_RootObjectBase).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x30])(this,(ulong)(uint)propertyId);
      attributes = '\0';
      if (iVar1 != 0) {
        attributes = '\x04';
      }
      PropertyValueInfo::Set
                (info,(RecyclableObject *)this,propertyIndex,attributes,InlineCacheNoFlags);
      iVar1 = (*(this->super_RootObjectBase).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x23])(this,(ulong)(uint)propertyId);
      if (iVar1 != 0) {
        PropertyValueInfo::DisableStoreFieldCache(info);
      }
    }
    this_local._4_4_ = Property_Found;
  }
  return this_local._4_4_;
}

Assistant:

PropertyQueryFlags ModuleRoot::GetPropertyReferenceQuery(Var originalInstance, PropertyId propertyId, Var* value, PropertyValueInfo* info,
        ScriptContext* requestContext)
    {
        PropertyIndex index = GetPropertyIndex(propertyId);
        if (index != Constants::NoSlot)
        {
            *value = this->GetSlot(index);
            if (info) // Avoid testing IsWritable if info not being queried
            {
                PropertyValueInfo::Set(info, this, index, IsWritable(propertyId) ? PropertyWritable : PropertyNone);
#if ENABLE_FIXED_FIELDS
                if (this->IsFixedProperty(propertyId))
                {
                    PropertyValueInfo::DisableStoreFieldCache(info);
                }
#endif
            }
            return PropertyQueryFlags::Property_Found;
        }
        if (this->hostObject && JavascriptOperators::GetPropertyReference(this->hostObject, propertyId, value, requestContext))
        {
            return PropertyQueryFlags::Property_NotFound;
        }

        //
        // Try checking the global object
        // if the module root doesn't have the property and the host object also doesn't have it
        //

        GlobalObject* globalObj = this->GetLibrary()->GetGlobalObject();
        return globalObj->GlobalObject::GetPropertyReferenceQuery(originalInstance, propertyId, value, NULL, requestContext);
    }